

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Color ColorAlphaBlend(Color dst,Color src,Color tint)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  
  uVar7 = (uint)dst >> 8;
  uVar6 = (uint)dst >> 0x10;
  uVar5 = (uint)dst >> 0x18;
  uVar9 = (((uint)tint >> 0x18) + 1) * ((uint)src >> 0x18) >> 8;
  if (uVar9 != 0) {
    uVar2 = (((uint)tint & 0xff) + 1) * ((uint)src & 0xff);
    uVar1 = (((uint)tint >> 8 & 0xff) + 1) * ((uint)src >> 8 & 0xff) >> 8;
    uVar8 = (((uint)tint >> 0x10 & 0xff) + 1) * ((uint)src >> 0x10 & 0xff) >> 8;
    if (uVar9 == 0xff) {
      dst = (Color)(uVar2 >> 8);
      uVar7 = uVar1;
      uVar6 = uVar8;
      uVar5 = 0xff;
    }
    else {
      uVar3 = uVar9 ^ 0xff;
      uVar4 = (uVar3 * uVar5 >> 8) + uVar9 + 1;
      uVar11 = uVar4 & 0xff;
      if (uVar11 == 0) {
        dst.r = 0xff;
        dst.g = '\0';
        dst.b = '\0';
        dst.a = '\0';
        uVar7 = 0xff;
        uVar6 = 0xff;
        uVar5 = uVar4;
      }
      else {
        dst = (Color)((((uint)dst & 0xff) * uVar5 * uVar3 + (uVar2 & 0x1ff00) * (uVar9 + 1)) /
                      uVar11 >> 8);
        iVar10 = (uVar9 + 1) * 0x100;
        uVar7 = ((uVar7 & 0xff) * uVar5 * uVar3 + uVar1 * iVar10) / uVar11 >> 8;
        uVar6 = ((uVar6 & 0xff) * uVar5 * uVar3 + iVar10 * uVar8) / uVar11 >> 8;
        uVar5 = uVar4;
      }
    }
  }
  return (Color)((uint)dst & 0xff | (uVar7 & 0xff) << 8 | (uVar6 & 0xff) << 0x10 | uVar5 << 0x18);
}

Assistant:

Color ColorAlphaBlend(Color dst, Color src, Color tint)
{
    Color out = WHITE;

    // Apply color tint to source color
    src.r = (unsigned char)(((unsigned int)src.r*((unsigned int)tint.r+1)) >> 8);
    src.g = (unsigned char)(((unsigned int)src.g*((unsigned int)tint.g+1)) >> 8);
    src.b = (unsigned char)(((unsigned int)src.b*((unsigned int)tint.b+1)) >> 8);
    src.a = (unsigned char)(((unsigned int)src.a*((unsigned int)tint.a+1)) >> 8);

//#define COLORALPHABLEND_FLOAT
#define COLORALPHABLEND_INTEGERS
#if defined(COLORALPHABLEND_INTEGERS)
    if (src.a == 0) out = dst;
    else if (src.a == 255) out = src;
    else
    {
        unsigned int alpha = (unsigned int)src.a + 1;     // We are shifting by 8 (dividing by 256), so we need to take that excess into account
        out.a = (unsigned char)(((unsigned int)alpha*256 + (unsigned int)dst.a*(256 - alpha)) >> 8);

        if (out.a > 0)
        {
            out.r = (unsigned char)((((unsigned int)src.r*alpha*256 + (unsigned int)dst.r*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
            out.g = (unsigned char)((((unsigned int)src.g*alpha*256 + (unsigned int)dst.g*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
            out.b = (unsigned char)((((unsigned int)src.b*alpha*256 + (unsigned int)dst.b*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
        }
    }
#endif
#if defined(COLORALPHABLEND_FLOAT)
    if (src.a == 0) out = dst;
    else if (src.a == 255) out = src;
    else
    {
        Vector4 fdst = ColorNormalize(dst);
        Vector4 fsrc = ColorNormalize(src);
        Vector4 ftint = ColorNormalize(tint);
        Vector4 fout = { 0 };

        fout.w = fsrc.w + fdst.w*(1.0f - fsrc.w);

        if (fout.w > 0.0f)
        {
            fout.x = (fsrc.x*fsrc.w + fdst.x*fdst.w*(1 - fsrc.w))/fout.w;
            fout.y = (fsrc.y*fsrc.w + fdst.y*fdst.w*(1 - fsrc.w))/fout.w;
            fout.z = (fsrc.z*fsrc.w + fdst.z*fdst.w*(1 - fsrc.w))/fout.w;
        }

        out = (Color){ (unsigned char)(fout.x*255.0f), (unsigned char)(fout.y*255.0f), (unsigned char)(fout.z*255.0f), (unsigned char)(fout.w*255.0f) };
    }
#endif

    return out;
}